

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O0

int wsio_setoption(CONCRETE_IO_HANDLE ws_io,char *optionName,void *value)

{
  int iVar1;
  OPTIONHANDLER_RESULT OVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  WSIO_INSTANCE *wsio_instance;
  LOGGER_LOG l;
  int result;
  void *value_local;
  char *optionName_local;
  CONCRETE_IO_HANDLE ws_io_local;
  
  if ((ws_io == (CONCRETE_IO_HANDLE)0x0) || (optionName == (char *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                ,"wsio_setoption",0x29a,1,"Bad parameters: ws_io=%p, optionName=%p",ws_io,optionName
               );
    }
    l._4_4_ = 0x29b;
  }
  else {
    iVar1 = strcmp(WSIO_OPTIONS,optionName);
    if (iVar1 == 0) {
      OVar2 = OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value,*(void **)((long)ws_io + 0x50));
      if (OVar2 == OPTIONHANDLER_OK) {
        l._4_4_ = 0;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                    ,"wsio_setoption",0x2a7,1,"unable to OptionHandler_FeedOptions");
        }
        l._4_4_ = 0x2a8;
      }
    }
    else {
      iVar1 = uws_client_set_option(*(UWS_CLIENT_HANDLE *)((long)ws_io + 0x50),optionName,value);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                    ,"wsio_setoption",0x2b6,1,"Setting the option %s failed",optionName);
        }
        l._4_4_ = 0x2b7;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int wsio_setoption(CONCRETE_IO_HANDLE ws_io, const char* optionName, const void* value)
{
    int result;
    if (
        /* Codes_SRS_WSIO_01_109: [ If any of the arguments ws_io or option_name is NULL wsio_setoption shall return a non-zero value. ]*/
        (ws_io == NULL) ||
        (optionName == NULL)
        )
    {
        LogError("Bad parameters: ws_io=%p, optionName=%p",
            ws_io, optionName);
        result = MU_FAILURE;
    }
    else
    {
        WSIO_INSTANCE* wsio_instance = (WSIO_INSTANCE*)ws_io;

        if (strcmp(WSIO_OPTIONS, optionName) == 0)
        {
            /* Codes_SRS_WSIO_01_183: [ If the option name is WSIOOptions then wsio_setoption shall call OptionHandler_FeedOptions and pass to it the underlying IO handle and the value argument. ]*/
            if (OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value, wsio_instance->uws) != OPTIONHANDLER_OK)
            {
                /* Codes_SRS_WSIO_01_184: [ If OptionHandler_FeedOptions fails, wsio_setoption shall fail and return a non-zero value. ]*/
                LogError("unable to OptionHandler_FeedOptions");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_WSIO_01_158: [ On success, wsio_setoption shall return 0. ]*/
                result = 0;
            }
        }
        else
        {
            /* Codes_SRS_WSIO_01_156: [ Otherwise all options shall be passed as they are to uws by calling uws_client_set_option. ]*/
            if (uws_client_set_option(wsio_instance->uws, optionName, value) != 0)
            {
                /* Codes_SRS_WSIO_01_157: [ If uws_client_set_option fails, wsio_setoption shall fail and return a non-zero value. ]*/
                LogError("Setting the option %s failed", optionName);
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_WSIO_01_158: [ On success, wsio_setoption shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}